

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O0

size_t al_ustr_size_utf16(ALLEGRO_USTR *us)

{
  size_t sVar1;
  int32_t c;
  size_t sz;
  int pos;
  undefined4 in_stack_ffffffffffffffe0;
  int32_t in_stack_ffffffffffffffe4;
  ALLEGRO_USTR *us_00;
  
  us_00 = (ALLEGRO_USTR *)0x0;
  while( true ) {
    in_stack_ffffffffffffffe4 =
         al_ustr_get_next(us_00,(int *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
                         );
    if (in_stack_ffffffffffffffe4 < 0) break;
    sVar1 = al_utf16_width(in_stack_ffffffffffffffe4);
    us_00 = (ALLEGRO_USTR *)((long)&us_00->mlen + sVar1);
  }
  return (size_t)(undefined1 *)((long)&us_00->mlen + 2);
}

Assistant:

size_t al_ustr_size_utf16(const ALLEGRO_USTR *us)
{
   int pos = 0;
   size_t sz = 0;
   while (1) {
      int32_t c = al_ustr_get_next(us, &pos);
      if (c < 0)
         break;
      sz += al_utf16_width(c);
   }
   /* Size of terminating 0 character - al_ustr_get_next will not
    * return it.
    */
   sz += 2;
   return sz;
}